

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressDXT.cpp
# Opt level: O2

void __thiscall nv::FastCompressor::compressDXT5(FastCompressor *this,Private *outputOptions)

{
  OutputHandler *pOVar1;
  uint uVar2;
  uint uVar3;
  uint x;
  uint uVar4;
  uint y;
  uint uVar5;
  BlockDXT5 block;
  ColorBlock rgba;
  
  uVar2 = Image::width(this->m_image);
  uVar3 = Image::height(this->m_image);
  ColorBlock::ColorBlock(&rgba);
  for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 4) {
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 4) {
      ColorBlock::init(&rgba,(EVP_PKEY_CTX *)this->m_image);
      QuickCompress::compressDXT5(&rgba,&block,0);
      pOVar1 = outputOptions->outputHandler;
      if (pOVar1 != (OutputHandler *)0x0) {
        (*pOVar1->_vptr_OutputHandler[3])(pOVar1,&block,0x10);
      }
    }
  }
  return;
}

Assistant:

void nv::FastCompressor::compressDXT5(const nvtt::OutputOptions::Private & outputOptions)
{
	const uint w = m_image->width();
	const uint h = m_image->height();
	
	ColorBlock rgba;
	BlockDXT5 block;

	for (uint y = 0; y < h; y += 4) {
		for (uint x = 0; x < w; x += 4) {
			rgba.init(m_image, x, y);
			
			QuickCompress::compressDXT5(rgba, &block, 0);
			
			if (outputOptions.outputHandler != NULL) {
				outputOptions.outputHandler->writeData(&block, sizeof(block));
			}
		}
	}
}